

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

void __thiscall TextReader::read_token(TextReader *this,char *value)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  allocator local_c1;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  string local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  load_next_token(this);
  uVar6 = this->current_token_len_;
  if (uVar6 != 0) {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (value[uVar4] == '\0') break;
      if ((this->current_line_)._M_dataplus._M_p[uVar4 + this->current_token_pos_] != value[uVar4])
      goto LAB_0010c605;
      uVar4 = uVar4 + 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar4);
    if (uVar6 == ((int)uVar5 + 1) - (uint)(value[uVar5] == '\0')) {
      this->current_token_pos_ = this->current_token_pos_ + uVar6;
      this->current_token_len_ = 0;
      this->current_token_type_ = ttUnknown;
      return;
    }
  }
LAB_0010c605:
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Expect \"","");
  std::__cxx11::string::string((string *)&local_60,value,&local_c1);
  uVar6 = 0xf;
  if (local_40 != local_30) {
    uVar6 = local_30[0];
  }
  if (uVar6 < (ulong)(local_58 + local_38)) {
    uVar6 = 0xf;
    if (local_60 != local_50) {
      uVar6 = local_50[0];
    }
    if (uVar6 < (ulong)(local_58 + local_38)) goto LAB_0010c688;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
  }
  else {
LAB_0010c688:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
  }
  local_c0 = &local_b0;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_b0 = *puVar1;
    uStack_a8 = *(undefined4 *)(puVar3 + 3);
    uStack_a4 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_b0 = *puVar1;
    local_c0 = (ulong *)*puVar3;
  }
  local_b8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\" token","");
  uVar6 = 0xf;
  if (local_c0 != &local_b0) {
    uVar6 = local_b0;
  }
  if (uVar6 < (ulong)(local_78 + local_b8)) {
    uVar6 = 0xf;
    if (local_80 != local_70) {
      uVar6 = local_70[0];
    }
    if ((ulong)(local_78 + local_b8) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_c0);
      goto LAB_0010c773;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_80);
LAB_0010c773:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar2 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_a0._M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  parse_error(this,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

inline void read_token(const char* value) {
        if (is_token(value))
            skip_token();
        else
            parse_error(std::string("Expect \"") + std::string(value) + std::string("\" token"));
    }